

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::checkForCorruption
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *file,size_t line,
          TestMemoryAllocator *allocator,bool allocateNodesSeperately)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  TestMemoryAllocator *freeAllocator;
  undefined4 extraout_var_01;
  size_t allocLine;
  char *allocFile;
  ulong uVar6;
  char *message;
  size_t allocSize;
  TestMemoryAllocator *allocAllocator;
  long *plVar5;
  undefined4 extraout_var_00;
  
  plVar4 = (long *)(**(code **)(**(long **)(node + 0x28) + 0x50))();
  iVar3 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (((plVar4 == plVar5) || (this->doAllocationTypeChecking_ != true)) ||
     (cVar2 = (**(code **)(*plVar5 + 0x38))(plVar5), cVar2 != '\0')) {
    if (*(char *)(*(long *)(node + 0x10) + *(long *)node) == 'B') {
      uVar1 = 0;
      do {
        uVar6 = uVar1;
        if (uVar6 == 2) break;
        uVar1 = uVar6 + 1;
      } while (*(char *)(*(long *)node + *(long *)(node + 0x10) + 1 + uVar6) == "BAS"[uVar6 + 1]);
      if (1 < uVar6) {
        if (!allocateNodesSeperately) {
          return;
        }
        (*allocator->_vptr_TestMemoryAllocator[9])(allocator,node);
        return;
      }
    }
    iVar3 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
    freeAllocator = (TestMemoryAllocator *)CONCAT44(extraout_var_00,iVar3);
    allocSize = *(size_t *)node;
    allocFile = *(char **)(node + 0x18);
    allocLine = *(size_t *)(node + 0x20);
    allocAllocator = *(TestMemoryAllocator **)(node + 0x28);
    message = "Memory corruption (written out of bounds?)\n";
  }
  else {
    iVar3 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
    freeAllocator = (TestMemoryAllocator *)CONCAT44(extraout_var_01,iVar3);
    allocSize = *(size_t *)node;
    allocFile = *(char **)(node + 0x18);
    allocLine = *(size_t *)(node + 0x20);
    allocAllocator = *(TestMemoryAllocator **)(node + 0x28);
    message = "Allocation/deallocation type mismatch\n";
  }
  MemoryLeakOutputStringBuffer::reportFailure
            (&this->outputBuffer_,message,allocFile,allocLine,allocSize,allocAllocator,file,line,
             freeAllocator,this->reporter_);
  return;
}

Assistant:

void MemoryLeakDetector::checkForCorruption(MemoryLeakDetectorNode* node, const char* file, size_t line, TestMemoryAllocator* allocator, bool allocateNodesSeperately)
{
    if (!matchingAllocation(node->allocator_->actualAllocator(), allocator->actualAllocator()))
        outputBuffer_.reportAllocationDeallocationMismatchFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (!validMemoryCorruptionInformation(node->memory_ + node->size_))
        outputBuffer_.reportMemoryCorruptionFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (allocateNodesSeperately)
        allocator->freeMemoryLeakNode((char*) node);
}